

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram_p.h
# Opt level: O0

void __thiscall
QNetworkDatagramPrivate::QNetworkDatagramPrivate
          (QNetworkDatagramPrivate *this,QByteArray *data,QHostAddress *dstAddr,quint16 port)

{
  quint16 in_CX;
  QHostAddress *in_RDX;
  QIpPacketHeader *in_RSI;
  QByteArray *in_RDI;
  undefined6 in_stack_ffffffffffffffe0;
  
  QByteArray::QByteArray((QByteArray *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_RDI);
  QIpPacketHeader::QIpPacketHeader(in_RSI,in_RDX,in_CX);
  return;
}

Assistant:

QNetworkDatagramPrivate(const QByteArray &data = QByteArray(),
                            const QHostAddress &dstAddr = QHostAddress(), quint16 port = 0)
        : data(data), header(dstAddr, port)
    {}